

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3.h
# Opt level: O0

void L3_imdct_short(float *grbuf,float *overlap,int nbands)

{
  float local_68;
  float fStack_64;
  float tmp [18];
  float *pfStack_18;
  int nbands_local;
  float *overlap_local;
  float *grbuf_local;
  
  pfStack_18 = overlap;
  overlap_local = grbuf;
  for (tmp[0x11] = (float)nbands; 0 < (int)tmp[0x11]; tmp[0x11] = (float)((int)tmp[0x11] + -1)) {
    memcpy(&local_68,overlap_local,0x48);
    *(undefined8 *)overlap_local = *(undefined8 *)pfStack_18;
    *(undefined8 *)(overlap_local + 2) = *(undefined8 *)(pfStack_18 + 2);
    *(undefined8 *)(overlap_local + 4) = *(undefined8 *)(pfStack_18 + 4);
    L3_imdct12(&local_68,overlap_local + 6,pfStack_18 + 6);
    L3_imdct12(&fStack_64,overlap_local + 0xc,pfStack_18 + 6);
    L3_imdct12(tmp,pfStack_18,pfStack_18 + 6);
    pfStack_18 = pfStack_18 + 9;
    overlap_local = overlap_local + 0x12;
  }
  return;
}

Assistant:

static void L3_imdct_short(float *grbuf, float *overlap, int nbands)
{
    for (;nbands > 0; nbands--, overlap += 9, grbuf += 18)
    {
        float tmp[18];
        memcpy(tmp, grbuf, sizeof(tmp));
        memcpy(grbuf, overlap, 6*sizeof(float));
        L3_imdct12(tmp, grbuf + 6, overlap + 6);
        L3_imdct12(tmp + 1, grbuf + 12, overlap + 6);
        L3_imdct12(tmp + 2, overlap, overlap + 6);
    }
}